

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O2

void __thiscall
Analysis::UpdateParameterDict(Analysis *this,string *param_filename,int argc,char **argv)

{
  ParameterReader *this_00;
  allocator local_91;
  double local_90;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = &this->paraRdr_;
  std::__cxx11::string::string((string *)&local_48,(string *)param_filename);
  ParameterReader::readFromFile(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"#",&local_91);
  ParameterReader::readFromArguments(this_00,(long)argc,argv,&local_68,1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_88,"readRapidityShiftFromFile",&local_91);
  local_90 = ParameterReader::getVal(this_00,&local_88,0.0);
  std::__cxx11::string::~string((string *)&local_88);
  if ((local_90 == 1.0) && (!NAN(local_90))) {
    setRapiditySfhitFromFile(this);
  }
  ParameterReader::echo(this_00);
  return;
}

Assistant:

void Analysis::UpdateParameterDict(
    std::string param_filename, int argc, char *argv[]) {
    paraRdr_.readFromFile(param_filename);
    paraRdr_.readFromArguments(argc, argv);

    // rapidity shift from file
    if (paraRdr_.getVal("readRapidityShiftFromFile", 0) == 1) {
        setRapiditySfhitFromFile();
    }
    paraRdr_.echo();
}